

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O2

void __thiscall
fasttext::Model::dfs
          (Model *this,int32_t k,real threshold,int32_t node,real score,
          vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *heap,
          Vector *hidden)

{
  pointer *pppVar1;
  int32_t node_00;
  pointer ppVar2;
  pointer pNVar3;
  __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  __last;
  __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  __first;
  undefined1 auVar4 [16];
  long lVar5;
  Model *pMVar6;
  undefined1 auVar7 [16];
  real rVar8;
  float fVar9;
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  float local_4c;
  pair<float,_int> local_38;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  pMVar6 = this;
  local_4c = score;
  while( true ) {
    rVar8 = std_log(pMVar6,threshold);
    if (local_4c < rVar8) {
      return;
    }
    ppVar2 = (heap->
             super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    if (((long)(heap->
               super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
               _M_impl.super__Vector_impl_data._M_finish - (long)ppVar2 >> 3 == (long)k) &&
       (local_4c < ppVar2->first)) break;
    pNVar3 = (this->tree).super__Vector_base<fasttext::Node,_std::allocator<fasttext::Node>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar5 = (long)node;
    if ((pNVar3[lVar5].left == -1) && (pNVar3[lVar5].right == -1)) {
      local_38.first = local_4c;
      local_38.second = node;
      std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>::
      emplace_back<std::pair<float,int>>
                ((vector<std::pair<float,int>,std::allocator<std::pair<float,int>>> *)heap,&local_38
                );
      std::
      push_heap<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,bool(*)(std::pair<float,int>const&,std::pair<float,int>const&)>
                ((heap->
                 super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start,
                 (heap->
                 super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>)
                 ._M_impl.super__Vector_impl_data._M_finish,comparePairs);
      __last._M_current =
           (heap->super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      __first._M_current =
           (heap->super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(long)k < (ulong)((long)__last._M_current - (long)__first._M_current >> 3)) {
        std::
        pop_heap<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,bool(*)(std::pair<float,int>const&,std::pair<float,int>const&)>
                  (__first,__last,comparePairs);
        pppVar1 = &(heap->
                   super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *pppVar1 = *pppVar1 + -1;
      }
      return;
    }
    if ((this->quant_ == true) &&
       (((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->qout
        == true)) {
      pMVar6 = (Model *)(this->qwo_).
                        super___shared_ptr<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      auVar10._0_4_ = QMatrix::dotRow((QMatrix *)pMVar6,hidden,lVar5 - this->osz_);
      auVar10._4_60_ = extraout_var;
      auVar7 = auVar10._0_16_;
    }
    else {
      pMVar6 = (Model *)(this->wo_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr;
      auVar11._0_4_ = Matrix::dotRow((Matrix *)pMVar6,hidden,lVar5 - this->osz_);
      auVar11._4_60_ = extraout_var_00;
      auVar7 = auVar11._0_16_;
    }
    auVar4._8_4_ = 0x80000000;
    auVar4._0_8_ = 0x8000000080000000;
    auVar4._12_4_ = 0x80000000;
    auVar7 = vxorps_avx512vl(auVar7,auVar4);
    fVar9 = expf(auVar7._0_4_);
    node_00 = (this->tree).super__Vector_base<fasttext::Node,_std::allocator<fasttext::Node>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar5].left;
    fVar9 = 1.0 / (fVar9 + 1.0);
    rVar8 = std_log(pMVar6,1.0 - fVar9);
    pMVar6 = this;
    dfs(this,k,threshold,node_00,rVar8 + local_4c,heap,hidden);
    node = (this->tree).super__Vector_base<fasttext::Node,_std::allocator<fasttext::Node>_>._M_impl.
           super__Vector_impl_data._M_start[lVar5].right;
    rVar8 = std_log(pMVar6,fVar9);
    local_4c = local_4c + rVar8;
  }
  return;
}

Assistant:

void Model::dfs(
		int32_t k,
		real threshold,
		int32_t node,
		real score,
		std::vector<std::pair<real, int32_t>>& heap,
		Vector& hidden) const {
	if (score < std_log(threshold)) {
		return;
	}
	if (heap.size() == k && score < heap.front().first) {
		return;
	}

	if (tree[node].left == -1 && tree[node].right == -1) {
		heap.push_back(std::make_pair(score, node));
		std::push_heap(heap.begin(), heap.end(), comparePairs);
		if (heap.size() > k) {
			std::pop_heap(heap.begin(), heap.end(), comparePairs);
			heap.pop_back();
		}
		return;
	}

	real f;
	if (quant_ && args_->qout) {
		f = qwo_->dotRow(hidden, node - osz_);
	} else {
		f = wo_->dotRow(hidden, node - osz_);
	}
	f = 1. / (1 + std::exp(-f));

	dfs(k, threshold, tree[node].left, score + std_log(1.0 - f), heap, hidden);
	dfs(k, threshold, tree[node].right, score + std_log(f), heap, hidden);
}